

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::setSizeGrip(QMdiSubWindowPrivate *this,QSizeGrip *newSizeGrip)

{
  QWidget *this_00;
  Data *pDVar1;
  QLayout *pQVar2;
  QWidgetData *pQVar3;
  int iVar4;
  LayoutDirection LVar5;
  QStyle *pQVar6;
  QProxyStyle *this_01;
  long lVar7;
  Data *pDVar8;
  int __sig;
  long in_FS_OFFSET;
  QSize local_38;
  long local_30;
  QSizeGrip *pQVar9;
  
  __sig = (int)&local_38;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSizeGrip != (QSizeGrip *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pDVar1 = (this->sizeGrip).wp.d;
    if ((((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
        ((this->sizeGrip).wp.value == (QObject *)0x0)) &&
       (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
      pQVar2 = (this->super_QWidgetPrivate).layout;
      if (pQVar2 != (QLayout *)0x0) {
        iVar4 = (**(code **)(*(long *)pQVar2 + 0xb8))(pQVar2,newSizeGrip);
        if (iVar4 != -1) goto LAB_00456efc;
      }
      local_38 = (QSize)(**(code **)(*(long *)&newSizeGrip->super_QWidget + 0x70))(newSizeGrip);
      QWidget::setFixedSize(&newSizeGrip->super_QWidget,&local_38);
      pQVar2 = (this->super_QWidgetPrivate).layout;
      pQVar6 = QWidget::style(this_00);
      this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
      if (this_01 != (QProxyStyle *)0x0) {
        pQVar6 = QProxyStyle::baseStyle(this_01);
      }
      lVar7 = (**(code **)(*(long *)pQVar6 + 8))(pQVar6,"QMacStyle");
      if ((lVar7 == 0) && (pQVar2 != (QLayout *)0x0)) {
        QLayout::addWidget((this->super_QWidgetPrivate).layout,&newSizeGrip->super_QWidget);
        pQVar9 = newSizeGrip;
        QLayout::setAlignment
                  ((this->super_QWidgetPrivate).layout,&newSizeGrip->super_QWidget,(Alignment)0x42);
        __sig = (int)pQVar9;
      }
      else {
        QWidget::setParent(&newSizeGrip->super_QWidget,this_00);
        LVar5 = QWidget::layoutDirection(this_00);
        local_38.wd.m_i = 0;
        if (LVar5 == LeftToRight) {
          pQVar3 = (newSizeGrip->super_QWidget).data;
          local_38.wd.m_i =
               (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) -
               (pQVar3->crect).x2.m_i) + (pQVar3->crect).x1.m_i;
        }
        pQVar3 = (newSizeGrip->super_QWidget).data;
        local_38.ht.m_i =
             (((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) -
             (pQVar3->crect).y2.m_i) + (pQVar3->crect).y1.m_i;
        QWidget::move(&newSizeGrip->super_QWidget,(QPoint *)&local_38);
        pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)newSizeGrip);
        pDVar1 = (this->sizeGrip).wp.d;
        (this->sizeGrip).wp.d = pDVar8;
        (this->sizeGrip).wp.value = (QObject *)newSizeGrip;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar1 = *(int *)pDVar1 + -1;
          UNLOCK();
          if (*(int *)pDVar1 == 0) {
            operator_delete(pDVar1);
          }
        }
      }
      QWidget::raise(&newSizeGrip->super_QWidget,__sig);
      updateGeometryConstraints(this);
      QObject::installEventFilter((QObject *)newSizeGrip);
    }
  }
LAB_00456efc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setSizeGrip(QSizeGrip *newSizeGrip)
{
    Q_Q(QMdiSubWindow);
    if (!newSizeGrip || sizeGrip || q->windowFlags() & Qt::FramelessWindowHint)
        return;

    if (layout && layout->indexOf(newSizeGrip) != -1)
        return;
    newSizeGrip->setFixedSize(newSizeGrip->sizeHint());
    bool putSizeGripInLayout = layout ? true : false;
    if (isMacStyle(q->style()))
        putSizeGripInLayout = false;
    if (putSizeGripInLayout) {
        layout->addWidget(newSizeGrip);
        layout->setAlignment(newSizeGrip, Qt::AlignBottom | Qt::AlignRight);
    } else {
        newSizeGrip->setParent(q);
        newSizeGrip->move(q->isLeftToRight() ? q->width() - newSizeGrip->width() : 0,
                          q->height() - newSizeGrip->height());
        sizeGrip = newSizeGrip;
    }
    newSizeGrip->raise();
    updateGeometryConstraints();
    newSizeGrip->installEventFilter(q);
}